

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<float,float,float>
               (ImGuiDataType data_type,float *v,float v_speed,float v_min,float v_max,char *format,
               float power,ImGuiDragFlags flags)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiInputSource IVar4;
  int decimal_precision;
  float *pfVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_84;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  uVar6 = data_type & 0xfffffffe;
  bVar1 = false;
  if ((((v_min != v_max) || (NAN(v_min) || NAN(v_max))) && ((power != 1.0 || (NAN(power))))) &&
     (uVar6 == 8)) {
    bVar1 = v_max - v_min < 3.4028235e+38;
  }
  if ((v_speed == 0.0) && (!NAN(v_speed))) {
    if (((v_min != v_max) || (NAN(v_min) || NAN(v_max))) && (v_max - v_min < 3.4028235e+38)) {
      v_speed = (v_max - v_min) * GImGui->DragSpeedDefaultRatio;
    }
  }
  uVar7 = flags & 1;
  IVar4 = GImGui->ActiveIdSource;
  if (IVar4 == ImGuiInputSource_Mouse) {
    bVar3 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar3) || ((pIVar2->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar4 = pIVar2->ActiveIdSource;
      goto LAB_0013f937;
    }
    pfVar5 = ImVec2::operator[](&(pIVar2->IO).MouseDelta,(ulong)uVar7);
    fVar12 = *pfVar5;
    if ((pIVar2->IO).KeyAlt != false) {
      fVar12 = fVar12 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar12 = fVar12 * 10.0;
    }
  }
  else {
LAB_0013f937:
    fVar12 = 0.0;
    if (IVar4 == ImGuiInputSource_Nav) {
      decimal_precision = 0;
      if (uVar6 == 8) {
        decimal_precision = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      pfVar5 = ImVec2::operator[](&local_38,(ulong)uVar7);
      fVar12 = *pfVar5;
      fVar11 = GetMinimumStepAtDecimalPrecision(decimal_precision);
      v_speed = (float)((uint)v_speed & -(uint)(fVar11 <= v_speed) |
                       ~-(uint)(fVar11 <= v_speed) & (uint)fVar11);
    }
  }
  fVar12 = fVar12 * v_speed;
  fVar11 = fVar12;
  if (uVar7 != 0) {
    fVar11 = -fVar12;
  }
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    if ((*v < v_max) || (bVar8 = 1, fVar11 <= 0.0)) {
      bVar8 = -(*v <= v_min && fVar11 < 0.0);
    }
  }
  else {
    bVar8 = 0;
  }
  if (bVar1) {
    if ((fVar11 < 0.0) && (0.0 < pIVar2->DragCurrentAccum)) goto LAB_0013fa95;
    if (fVar11 <= 0.0) goto LAB_0013fa5d;
    bVar3 = pIVar2->DragCurrentAccum <= 0.0 && pIVar2->DragCurrentAccum != 0.0;
  }
  else {
LAB_0013fa5d:
    bVar3 = false;
  }
  if ((((pIVar2->ActiveIdIsJustActivated | bVar8) & 1) == 0) && (!bVar3)) {
    if ((fVar12 != 0.0) || (NAN(fVar12))) {
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar11;
      pIVar2->DragCurrentAccumDirty = true;
    }
    else if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    if (bVar1) {
      fVar10 = v_max - v_min;
      local_84 = powf((*v - v_min) / fVar10,1.0 / power);
      fVar9 = local_84 + pIVar2->DragCurrentAccum / fVar10;
      fVar12 = 1.0;
      if (fVar9 <= 1.0) {
        fVar12 = fVar9;
      }
      fVar12 = powf((float)(~-(uint)(fVar9 < 0.0) & (uint)fVar12),power);
      fVar12 = fVar12 * fVar10 + v_min;
    }
    else {
      fVar12 = *v + pIVar2->DragCurrentAccum;
      local_84 = 0.0;
    }
    fVar12 = RoundScalarWithFormatT<float,float>(format,data_type,fVar12);
    pIVar2->DragCurrentAccumDirty = false;
    if (bVar1) {
      fVar9 = powf((fVar12 - v_min) / (v_max - v_min),1.0 / power);
      fVar9 = fVar9 - local_84;
    }
    else {
      fVar9 = fVar12 - *v;
    }
    pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - fVar9;
    fVar12 = (float)(~-(uint)(fVar12 == 0.0) & (uint)fVar12);
    fVar9 = *v;
    if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
      if ((fVar9 != fVar12) || (NAN(fVar9) || NAN(fVar12))) {
        if ((fVar12 < v_min) || (((uVar6 != 8 && (fVar9 < fVar12)) && (fVar11 < 0.0)))) {
          fVar12 = v_min;
        }
        if ((v_max < fVar12) || (((uVar6 != 8 && (fVar12 < fVar9)) && (0.0 < fVar11)))) {
          fVar12 = v_max;
        }
      }
    }
    if ((fVar9 == fVar12) && (!NAN(fVar9) && !NAN(fVar12))) {
      return false;
    }
    *v = fVar12;
    return true;
  }
LAB_0013fa95:
  pIVar2->DragCurrentAccum = 0.0;
  pIVar2->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool has_min_max = (v_min != v_max);
    const bool is_power = (power != 1.0f && is_decimal && has_min_max && (v_max - v_min < FLT_MAX));

    // Default tweak speed
    if (v_speed == 0.0f && has_min_max && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = has_min_max && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (TYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (TYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && has_min_max)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}